

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int64 ma_dr_wav_aiff_extented_to_s64(ma_uint8 *data)

{
  ma_uint8 mVar1;
  uint uVar2;
  int sign;
  ma_uint64 significand;
  ma_uint64 lo;
  ma_uint64 hi;
  ma_uint32 exponent;
  ma_uint8 *data_local;
  ulong local_8;
  
  mVar1 = *data;
  local_8 = ((ulong)data[2] << 0x18 | (ulong)data[3] << 0x10 | (ulong)data[4] << 8 | (ulong)data[5])
            << 0x20 | (ulong)data[6] << 0x18 | (ulong)data[7] << 0x10 | (ulong)data[8] << 8 |
                      (ulong)data[9];
  uVar2 = CONCAT11(mVar1,data[1]) & 0x7fff;
  if (((CONCAT11(mVar1,data[1]) & 0x7fff) == 0) && (local_8 == 0)) {
    local_8 = 0;
  }
  else if (uVar2 == 0x7fff) {
    local_8 = 0x7fffffffffffffff;
    if ((char)mVar1 < '\0') {
      local_8 = 0x8000000000000000;
    }
  }
  else {
    uVar2 = uVar2 - 0x3fff;
    if (uVar2 < 0x40) {
      if (uVar2 == 0) {
        local_8 = 0;
      }
      else {
        local_8 = local_8 >> (0x3fU - (char)uVar2 & 0x3f);
        if ((char)mVar1 < '\0') {
          local_8 = -local_8;
        }
      }
    }
    else {
      local_8 = 0x7fffffffffffffff;
      if ((char)mVar1 < '\0') {
        local_8 = 0x8000000000000000;
      }
    }
  }
  return local_8;
}

Assistant:

MA_PRIVATE ma_int64 ma_dr_wav_aiff_extented_to_s64(const ma_uint8* data)
{
    ma_uint32 exponent = ((ma_uint32)data[0] << 8) | data[1];
    ma_uint64 hi = ((ma_uint64)data[2] << 24) | ((ma_uint64)data[3] << 16) | ((ma_uint64)data[4] <<  8) | ((ma_uint64)data[5] <<  0);
    ma_uint64 lo = ((ma_uint64)data[6] << 24) | ((ma_uint64)data[7] << 16) | ((ma_uint64)data[8] <<  8) | ((ma_uint64)data[9] <<  0);
    ma_uint64 significand = (hi << 32) | lo;
    int sign = exponent >> 15;
    exponent &= 0x7FFF;
    if (exponent == 0 && significand == 0) {
        return 0;
    } else if (exponent == 0x7FFF) {
        return sign ? MA_DR_WAV_INT64_MIN : MA_DR_WAV_INT64_MAX;
    }
    exponent -= 16383;
    if (exponent > 63) {
        return sign ? MA_DR_WAV_INT64_MIN : MA_DR_WAV_INT64_MAX;
    } else if (exponent < 1) {
        return 0;
    }
    significand >>= (63 - exponent);
    if (sign) {
        return -(ma_int64)significand;
    } else {
        return  (ma_int64)significand;
    }
}